

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_add2hash2(FIOBJ dest,char *name,size_t name_len,FIOBJ val,uint8_t encoded)

{
  long lVar1;
  void *pvVar2;
  char *o;
  FIOBJ FVar3;
  size_t sVar4;
  uint64_t uVar5;
  int *piVar6;
  bool bVar7;
  FIOBJ local_120;
  FIOBJ local_118;
  FIOBJ local_110;
  FIOBJ local_108;
  size_t local_100;
  FIOBJ local_f8;
  FIOBJ local_f0;
  size_t local_e8;
  FIOBJ key_5;
  FIOBJ tmp_3;
  FIOBJ key_4;
  FIOBJ ary;
  uint64_t hash_2;
  FIOBJ tmp_2;
  FIOBJ old;
  FIOBJ key_3;
  FIOBJ key_2;
  FIOBJ tmp_1;
  uint64_t hash_1;
  size_t len_1;
  FIOBJ tmp;
  FIOBJ key_1;
  FIOBJ key;
  uint64_t hash;
  size_t len;
  uint32_t nesting;
  char *cut1;
  FIOBJ nested_ary;
  uint8_t encoded_local;
  FIOBJ val_local;
  size_t name_len_local;
  char *name_local;
  FIOBJ dest_local;
  
  if (name != (char *)0x0) {
    cut1 = (char *)0x0;
    val_local = name_len;
    name_len_local = (size_t)name;
    while( true ) {
      bVar7 = false;
      if (val_local != 0) {
        bVar7 = *(char *)name_len_local == '[';
      }
      if (!bVar7) break;
      val_local = val_local - 1;
      name_len_local = name_len_local + 1;
    }
    if (val_local != 0) {
      len._4_4_ = 0xffffffff;
      name_local = (char *)dest;
      while (len._4_4_ != 0) {
        len._4_4_ = len._4_4_ >> 1;
        pvVar2 = memchr((void *)name_len_local,0x5b,val_local);
        if (pvVar2 == (void *)0x0) {
          if (*(char *)(name_len_local + (val_local - 1)) == ']') {
            val_local = val_local - 1;
          }
          if (encoded == '\0') {
            local_110 = fiobj_str_new((char *)name_len_local,val_local);
          }
          else {
            local_110 = http_urlstr2fiobj((char *)name_len_local,val_local);
          }
          FVar3 = fiobj_hash_replace((FIOBJ)name_local,local_110,val);
          if (FVar3 != 0) {
            if (cut1 == (char *)0x0) {
              sVar4 = fiobj_type_is(FVar3,FIOBJ_T_ARRAY);
              tmp_2 = FVar3;
              if (sVar4 == 0) {
                tmp_2 = fiobj_ary_new2(4);
                fiobj_ary_push(tmp_2,FVar3);
              }
              fiobj_ary_push(tmp_2,val);
              fiobj_hash_replace((FIOBJ)name_local,local_110,tmp_2);
            }
            else {
              fiobj_hash_replace((FIOBJ)name_local,local_110,FVar3);
              FVar3 = fiobj_hash_new();
              fiobj_hash_set(FVar3,local_110,val);
              fiobj_ary_push((FIOBJ)cut1,FVar3);
            }
          }
          fiobj_free(local_110);
          return 0;
        }
        if (pvVar2 == (void *)name_len_local) break;
        if ((long)pvVar2 + 1 == name_len_local + val_local) {
          val_local = val_local - 1;
LAB_00175b76:
          if (*(char *)(name_len_local + (val_local - 1)) == ']') {
            val_local = val_local - 1;
          }
          uVar5 = fiobj_hash_string((void *)name_len_local,val_local);
          FVar3 = fiobj_hash_get2((FIOBJ)name_local,uVar5);
          if (FVar3 == 0) {
            if (encoded == '\0') {
              local_118 = fiobj_str_new((char *)name_len_local,val_local);
            }
            else {
              local_118 = http_urlstr2fiobj((char *)name_len_local,val_local);
            }
            key_4 = fiobj_ary_new2(4);
            fiobj_hash_set((FIOBJ)name_local,local_118,key_4);
            fiobj_free(local_118);
          }
          else {
            sVar4 = fiobj_type_is(FVar3,FIOBJ_T_ARRAY);
            key_4 = FVar3;
            if (sVar4 == 0) {
              key_4 = fiobj_ary_new2(4);
              fiobj_ary_push(key_4,FVar3);
              if (encoded == '\0') {
                local_120 = fiobj_str_new((char *)name_len_local,val_local);
              }
              else {
                local_120 = http_urlstr2fiobj((char *)name_len_local,val_local);
              }
              fiobj_hash_replace((FIOBJ)name_local,local_120,key_4);
              fiobj_free(local_120);
            }
          }
          fiobj_ary_push(key_4,val);
          return 0;
        }
        if (*(char *)((long)pvVar2 + 1) == ']') {
          if ((long)pvVar2 + 2 == name_len_local + val_local) {
            val_local = val_local - 2;
            goto LAB_00175b76;
          }
          if ((*(char *)((long)pvVar2 + 2) != '[') || (*(char *)((long)pvVar2 + 3) == ']')) break;
          if (*(char *)((long)pvVar2 + -1) == ']') {
            lVar1 = -1 - name_len_local;
          }
          else {
            lVar1 = -name_len_local;
          }
          local_e8 = (long)pvVar2 + lVar1;
          uVar5 = fiobj_hash_string((void *)name_len_local,local_e8);
          o = (char *)fiobj_hash_get2((FIOBJ)name_local,uVar5);
          if (o == (char *)0x0) {
            if (encoded == '\0') {
              local_f0 = fiobj_str_new((char *)name_len_local,local_e8);
            }
            else {
              local_f0 = http_urlstr2fiobj((char *)name_len_local,local_e8);
            }
            cut1 = (char *)fiobj_ary_new2(4);
            fiobj_hash_set((FIOBJ)name_local,local_f0,(FIOBJ)cut1);
            fiobj_free(local_f0);
          }
          else {
            sVar4 = fiobj_type_is((FIOBJ)o,FIOBJ_T_ARRAY);
            cut1 = o;
            if (sVar4 == 0) {
              if (encoded == '\0') {
                local_f8 = fiobj_str_new((char *)name_len_local,local_e8);
              }
              else {
                local_f8 = http_urlstr2fiobj((char *)name_len_local,local_e8);
              }
              cut1 = (char *)fiobj_ary_new2(4);
              fiobj_ary_push((FIOBJ)cut1,(FIOBJ)o);
              fiobj_hash_set((FIOBJ)name_local,local_f8,(FIOBJ)cut1);
              fiobj_free(local_f8);
            }
          }
          name_local = (char *)fiobj_ary_index((FIOBJ)cut1,-1);
          if ((name_local == (char *)0x0) ||
             (sVar4 = fiobj_type_is((FIOBJ)name_local,FIOBJ_T_HASH), sVar4 == 0)) {
            name_local = (char *)fiobj_hash_new();
            fiobj_ary_push((FIOBJ)cut1,(FIOBJ)name_local);
          }
          val_local = val_local - (((long)pvVar2 + 3U) - name_len_local);
          name_len_local = (long)pvVar2 + 3U;
        }
        else {
          if (*(char *)((long)pvVar2 + -1) == ']') {
            lVar1 = -1 - name_len_local;
          }
          else {
            lVar1 = -name_len_local;
          }
          local_100 = (long)pvVar2 + lVar1;
          uVar5 = fiobj_hash_string((void *)name_len_local,local_100);
          key_2 = fiobj_hash_get2((FIOBJ)name_local,uVar5);
          if (key_2 == 0) {
            if (encoded == '\0') {
              local_108 = fiobj_str_new((char *)name_len_local,local_100);
            }
            else {
              local_108 = http_urlstr2fiobj((char *)name_len_local,local_100);
            }
            key_2 = fiobj_hash_new();
            fiobj_hash_set((FIOBJ)name_local,local_108,key_2);
            fiobj_free(local_108);
          }
          else {
            sVar4 = fiobj_type_is(key_2,FIOBJ_T_HASH);
            if (sVar4 == 0) break;
          }
          name_local = (char *)key_2;
          cut1 = (char *)0x0;
          val_local = val_local - (((long)pvVar2 + 1U) - name_len_local);
          name_len_local = (long)pvVar2 + 1U;
        }
      }
    }
  }
  fiobj_free(val);
  piVar6 = __errno_location();
  *piVar6 = 0x5f;
  return -1;
}

Assistant:

int http_add2hash2(FIOBJ dest, char *name, size_t name_len, FIOBJ val,
                   uint8_t encoded) {
  if (!name)
    goto error;
  FIOBJ nested_ary = FIOBJ_INVALID;
  char *cut1;
  /* we can't start with an empty object name */
  while (name_len && name[0] == '[') {
    --name_len;
    ++name;
  }
  if (!name_len) {
    /* an empty name is an error */
    goto error;
  }
  uint32_t nesting = ((uint32_t)~0);
rebase:
  /* test for nesting level limit (limit at 32) */
  if (!nesting)
    goto error;
  /* start clearing away bits. */
  nesting >>= 1;
  /* since we might be rebasing, notice that "name" might be "name]" */
  cut1 = memchr(name, '[', name_len);
  if (!cut1)
    goto place_in_hash;
  /* simple case "name=" (the "=" was already removed) */
  if (cut1 == name) {
    /* an empty name is an error */
    goto error;
  }
  if (cut1 + 1 == name + name_len) {
    /* we have name[= ... autocorrect */
    name_len -= 1;
    goto place_in_array;
  }

  if (cut1[1] == ']') {
    /* Nested Array "name[]..." */

    /* Test for name[]= */
    if ((cut1 + 2) == name + name_len) {
      name_len -= 2;
      goto place_in_array;
    }

    /* Test for a nested Array format error */
    if (cut1[2] != '[' || cut1[3] == ']') { /* error, we can't parse this */
      goto error;
    }

    /* we have name[][key...= */

    /* ensure array exists and it's an array + set nested_ary */
    const size_t len = ((cut1[-1] == ']') ? (size_t)((cut1 - 1) - name)
                                          : (size_t)(cut1 - name));
    const uint64_t hash =
        fiobj_hash_string(name, len); /* hash the current name */
    nested_ary = fiobj_hash_get2(dest, hash);
    if (!nested_ary) {
      /* create a new nested array */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      nested_ary = fiobj_ary_new2(4);
      fiobj_hash_set(dest, key, nested_ary);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(nested_ary, FIOBJ_T_ARRAY)) {
      /* convert existing object to an array - auto error correction */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      FIOBJ tmp = fiobj_ary_new2(4);
      fiobj_ary_push(tmp, nested_ary);
      nested_ary = tmp;
      fiobj_hash_set(dest, key, nested_ary);
      fiobj_free(key);
    }

    /* test if last object in the array is a hash - create hash if not */
    dest = fiobj_ary_index(nested_ary, -1);
    if (!dest || !FIOBJ_TYPE_IS(dest, FIOBJ_T_HASH)) {
      dest = fiobj_hash_new();
      fiobj_ary_push(nested_ary, dest);
    }

    /* rebase `name` to `key` and restart. */
    cut1 += 3; /* consume "[][" */
    name_len -= (size_t)(cut1 - name);
    name = cut1;
    goto rebase;

  } else {
    /* we have name[key]... */
    const size_t len = ((cut1[-1] == ']') ? (size_t)((cut1 - 1) - name)
                                          : (size_t)(cut1 - name));
    const uint64_t hash =
        fiobj_hash_string(name, len); /* hash the current name */
    FIOBJ tmp = fiobj_hash_get2(dest, hash);
    if (!tmp) {
      /* hash doesn't exist, create it */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      tmp = fiobj_hash_new();
      fiobj_hash_set(dest, key, tmp);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(tmp, FIOBJ_T_HASH)) {
      /* type error, referencing an existing object that isn't a Hash */
      goto error;
    }
    dest = tmp;
    /* no rollback is possible once we enter the new nesting level... */
    nested_ary = FIOBJ_INVALID;
    /* rebase `name` to `key` and restart. */
    cut1 += 1; /* consume "[" */
    name_len -= (size_t)(cut1 - name);
    name = cut1;
    goto rebase;
  }

place_in_hash:
  if (name[name_len - 1] == ']')
    --name_len;
  {
    FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                        : fiobj_str_new(name, name_len);
    FIOBJ old = fiobj_hash_replace(dest, key, val);
    if (old) {
      if (nested_ary) {
        fiobj_hash_replace(dest, key, old);
        old = fiobj_hash_new();
        fiobj_hash_set(old, key, val);
        fiobj_ary_push(nested_ary, old);
      } else {
        if (!FIOBJ_TYPE_IS(old, FIOBJ_T_ARRAY)) {
          FIOBJ tmp = fiobj_ary_new2(4);
          fiobj_ary_push(tmp, old);
          old = tmp;
        }
        fiobj_ary_push(old, val);
        fiobj_hash_replace(dest, key, old);
      }
    }
    fiobj_free(key);
  }
  return 0;

place_in_array:
  if (name[name_len - 1] == ']')
    --name_len;
  {
    uint64_t hash = fiobj_hash_string(name, name_len);
    FIOBJ ary = fiobj_hash_get2(dest, hash);
    if (!ary) {
      FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                          : fiobj_str_new(name, name_len);
      ary = fiobj_ary_new2(4);
      fiobj_hash_set(dest, key, ary);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)) {
      FIOBJ tmp = fiobj_ary_new2(4);
      fiobj_ary_push(tmp, ary);
      ary = tmp;
      FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                          : fiobj_str_new(name, name_len);
      fiobj_hash_replace(dest, key, ary);
      fiobj_free(key);
    }
    fiobj_ary_push(ary, val);
  }
  return 0;
error:
  fiobj_free(val);
  errno = EOPNOTSUPP;
  return -1;
}